

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

String * __thiscall cm::String::operator=(String *this,initializer_list<char> il)

{
  String local_40;
  String *local_20;
  String *this_local;
  initializer_list<char> il_local;
  
  il_local._M_array = (iterator)il._M_len;
  this_local = (String *)il._M_array;
  local_20 = this;
  String(&local_40,il);
  operator=(this,&local_40);
  ~String(&local_40);
  return this;
}

Assistant:

String& operator=(std::initializer_list<char> il)
  {
    *this = String(il);
    return *this;
  }